

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O3

void __thiscall
happly::TypedListProperty<signed_char>::readNextBigEndian
          (TypedListProperty<signed_char> *this,istream *stream)

{
  undefined1 uVar1;
  int iVar2;
  pointer pcVar3;
  pointer pcVar4;
  iterator __position;
  undefined8 *puVar5;
  long lVar6;
  char *bytes;
  uint uVar7;
  pointer __new_size;
  size_t afterSize;
  size_t count;
  undefined8 local_38;
  ulong local_30;
  
  puVar5 = &local_38;
  local_30 = 0;
  std::istream::read((char *)stream,(long)&local_30);
  iVar2 = this->listCountBytes;
  if (iVar2 == 2) {
    local_30 = (ulong)(ushort)((ushort)local_30 << 8 | (ushort)local_30 >> 8);
  }
  else if (iVar2 == 4) {
    uVar7 = (uint)local_30;
    local_30 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                      uVar7 << 0x18);
  }
  else if (iVar2 == 8) {
    lVar6 = 7;
    local_38 = (pointer)local_30;
    do {
      uVar1 = *(undefined1 *)((long)&local_38 + lVar6);
      *(undefined1 *)((long)&local_38 + lVar6) = *(undefined1 *)puVar5;
      *(undefined1 *)puVar5 = uVar1;
      lVar6 = lVar6 + -1;
      puVar5 = (undefined8 *)((long)puVar5 + 1);
      local_30 = (ulong)local_38;
    } while (lVar6 != 3);
  }
  pcVar3 = (this->flattenedData).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pcVar4 = (this->flattenedData).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __new_size = pcVar3 + (local_30 - (long)pcVar4);
  local_38 = __new_size;
  geometrycentral::surface::std::vector<signed_char,_std::allocator<signed_char>_>::resize
            (&this->flattenedData,(size_type)__new_size);
  if (local_30 != 0) {
    std::istream::read((char *)stream,
                       (long)(pcVar3 + ((long)(this->flattenedData).
                                              super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start -
                                       (long)pcVar4)));
  }
  __position._M_current =
       (this->flattenedIndexStart).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->flattenedIndexStart).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_realloc_insert<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->flattenedIndexStart,
               __position,&local_38);
  }
  else {
    *__position._M_current = (unsigned_long)__new_size;
    (this->flattenedIndexStart).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

virtual void readNextBigEndian(std::istream& stream) override {

    // Read the size of the list
    size_t count = 0;
    stream.read(((char*)&count), listCountBytes);
    if (listCountBytes == 8) {
      count = (size_t)swapEndian((uint64_t)count);
    } else if (listCountBytes == 4) {
      count = (size_t)swapEndian((uint32_t)count);
    } else if (listCountBytes == 2) {
      count = (size_t)swapEndian((uint16_t)count);
    }

    // Read list elements
    size_t currSize = flattenedData.size();
    size_t afterSize = currSize + count;
    flattenedData.resize(afterSize);
    if (count > 0) {
      stream.read((char*)&flattenedData[currSize], count * sizeof(T));
    }
    flattenedIndexStart.emplace_back(afterSize);

    // Swap endian order of list elements
    for (size_t iFlat = currSize; iFlat < afterSize; iFlat++) {
      flattenedData[iFlat] = swapEndian(flattenedData[iFlat]);
    }
  }